

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O3

void __thiscall HttpServer::OnConnection(HttpServer *this,Handle *handle,uint32_t err)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 *puVar2;
  
  if (err != 0) {
    return;
  }
  puVar2 = (undefined4 *)operator_new(0x90);
  *puVar2 = 0;
  *(undefined8 *)(puVar2 + 2) = 0;
  *(undefined4 **)(puVar2 + 4) = puVar2 + 8;
  *(undefined8 *)(puVar2 + 6) = 0;
  *(undefined1 *)(puVar2 + 8) = 0;
  *(undefined4 **)(puVar2 + 0xc) = puVar2 + 0x10;
  *(undefined8 *)(puVar2 + 0xe) = 0;
  *(undefined1 *)(puVar2 + 0x10) = 0;
  *(undefined8 *)(puVar2 + 0x14) = 0;
  *(undefined8 *)(puVar2 + 0x16) = 0;
  *(undefined8 *)(puVar2 + 0x18) = 0;
  *(undefined8 *)(puVar2 + 0x1a) = 0;
  *(undefined8 *)(puVar2 + 0x1c) = 0;
  *(undefined8 *)(puVar2 + 0x1e) = 0;
  *(undefined4 **)(puVar2 + 0x16) = puVar2 + 0x22;
  *(undefined8 *)(puVar2 + 0x18) = 1;
  *(undefined8 *)(puVar2 + 0x1a) = 0;
  *(undefined8 *)(puVar2 + 0x1c) = 0;
  puVar2[0x1e] = 0x3f800000;
  *(undefined8 *)(puVar2 + 0x20) = 0;
  *(undefined8 *)(puVar2 + 0x22) = 0;
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  UNRECOVERED_JUMPTABLE = peVar1->_vptr_CNSocket[9];
  (*UNRECOVERED_JUMPTABLE)(peVar1,puVar2,puVar2 + 0x10,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HttpServer::OnConnection(cppnet::Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        auto context = new HttpContext();
        handle->SetContext((void*)context);
    }
}